

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib599.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  long lVar2;
  FILE *__stream;
  double content_length;
  undefined8 local_20;
  
  local_20 = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 != 0) {
      iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
      if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x2b,0), iVar1 == 0)) &&
          (iVar1 = curl_easy_setopt(lVar2,0x4e58,progress_callback), iVar1 == 0)) &&
         (((iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 == 0 &&
           (iVar1 = curl_easy_setopt(lVar2,0x34,1), iVar1 == 0)) &&
          ((iVar1 = curl_easy_setopt(lVar2,0x2a,1), iVar1 == 0 &&
           (iVar1 = curl_easy_perform(lVar2), iVar1 == 0)))))) {
        iVar1 = curl_easy_getinfo(lVar2,0x30000f,&local_20);
        __stream = fopen64(libtest_arg2,"wb");
        if (__stream != (FILE *)0x0) {
          curl_mfprintf(local_20,__stream,"CL: %.0f\n");
          fclose(__stream);
        }
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  double content_length = 0.0;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* we want to use our own progress function */
  test_setopt(curl, CURLOPT_NOPROGRESS, 0L);
  test_setopt(curl, CURLOPT_PROGRESSFUNCTION, progress_callback);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* follow redirects */
  test_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

  if(!res) {
    FILE *moo;
    res = curl_easy_getinfo(curl, CURLINFO_CONTENT_LENGTH_DOWNLOAD,
                            &content_length);
    moo = fopen(libtest_arg2, "wb");
    if(moo) {
      fprintf(moo, "CL: %.0f\n", content_length);
      fclose(moo);
    }
  }

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}